

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitUnary(I64ToI32Lowering *this,Unary *curr)

{
  UnaryOp UVar1;
  uintptr_t uVar2;
  bool bVar3;
  ostream *poVar4;
  
  if (((0x33 < (ulong)curr->op) || ((0xe478555e0002aU >> ((ulong)curr->op & 0x3f) & 1) == 0)) ||
     (bVar3 = handleUnreachable(this,(Expression *)curr), bVar3)) {
    return;
  }
  bVar3 = hasOutParam(this,curr->value);
  if (((!bVar3) &&
      (uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id,
      uVar2 != 3)) && (uVar2 != 5)) {
    __assert_fail("hasOutParam(curr->value) || curr->type == Type::i64 || curr->type == Type::f64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x3ae,"void wasm::I64ToI32Lowering::visitUnary(Unary *)");
  }
  UVar1 = curr->op;
  switch(UVar1) {
  case EqZInt64:
    lowerEqZInt64(this,curr);
    return;
  case ExtendSInt32:
    lowerExtendSInt32(this,curr);
    return;
  case ExtendUInt32:
    lowerExtendUInt32(this,curr);
    return;
  case WrapInt64:
    lowerWrapInt64(this,curr);
    return;
  case TruncSFloat32ToInt32:
  case TruncUFloat32ToInt32:
  case TruncSFloat64ToInt32:
  case TruncUFloat64ToInt32:
  case ReinterpretFloat32:
  case ConvertSInt32ToFloat32:
  case ConvertSInt32ToFloat64:
  case ConvertUInt32ToFloat32:
  case ConvertUInt32ToFloat64:
  case PromoteFloat32:
  case DemoteFloat64:
  case ReinterpretInt32:
  case ExtendS8Int32:
  case ExtendS16Int32:
    goto switchD_00a377a9_caseD_19;
  case TruncSFloat32ToInt64:
  case TruncUFloat32ToInt64:
  case TruncSFloat64ToInt64:
  case TruncUFloat64ToInt64:
    lowerTruncFloatToInt(this,curr);
    return;
  case ReinterpretFloat64:
    lowerReinterpretFloat64(this,curr);
    return;
  case ConvertSInt64ToFloat32:
  case ConvertSInt64ToFloat64:
  case ConvertUInt64ToFloat32:
  case ConvertUInt64ToFloat64:
    lowerConvertIntToFloat(this,curr);
    return;
  case ReinterpretInt64:
    lowerReinterpretInt64(this,curr);
    return;
  case ExtendS8Int64:
  case ExtendS16Int64:
  case ExtendS32Int64:
    lowerExtendSInt64(this,curr);
    return;
  default:
    if ((UVar1 == ClzInt64) || (UVar1 == CtzInt64)) {
      lowerCountZeros(this,curr);
      return;
    }
    if (UVar1 == PopcntInt64) {
      handle_unreachable("i64.popcnt should already be removed",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                         ,0x3d8);
    }
switchD_00a377a9_caseD_19:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Unhandled unary operator: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,curr->op);
    std::endl<char,std::char_traits<char>>(poVar4);
    abort();
  }
}

Assistant:

void visitUnary(Unary* curr) {
    if (!unaryNeedsLowering(curr->op)) {
      return;
    }
    if (handleUnreachable(curr)) {
      return;
    }
    assert(hasOutParam(curr->value) || curr->type == Type::i64 ||
           curr->type == Type::f64);
    switch (curr->op) {
      case ClzInt64:
      case CtzInt64:
        lowerCountZeros(curr);
        break;
      case EqZInt64:
        lowerEqZInt64(curr);
        break;
      case ExtendSInt32:
        lowerExtendSInt32(curr);
        break;
      case ExtendUInt32:
        lowerExtendUInt32(curr);
        break;
      case WrapInt64:
        lowerWrapInt64(curr);
        break;
      case ReinterpretFloat64:
        lowerReinterpretFloat64(curr);
        break;
      case ReinterpretInt64:
        lowerReinterpretInt64(curr);
        break;
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64:
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64:
        lowerTruncFloatToInt(curr);
        break;
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
        lowerConvertIntToFloat(curr);
        break;
      case ExtendS8Int64:
      case ExtendS16Int64:
      case ExtendS32Int64:
        lowerExtendSInt64(curr);
        break;
      case PopcntInt64:
        WASM_UNREACHABLE("i64.popcnt should already be removed");
      default:
        std::cerr << "Unhandled unary operator: " << curr->op << std::endl;
        abort();
    }
  }